

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O3

bool __thiscall
PrintVisitor::needParentheses(PrintVisitor *this,Expression *expression,OperatorChar op)

{
  bool bVar1;
  OperatorChar opChar;
  int iVar2;
  int iVar3;
  BinaryOperatorExpression *this_00;
  byte bVar4;
  CalculationEngine *this_01;
  byte bVar5;
  Operator nodeOperator;
  Operator inputOperator;
  Operator local_c0;
  Operator local_70;
  
  if (expression == (Expression *)0x0) {
    return false;
  }
  this_01 = (CalculationEngine *)0x0;
  this_00 = (BinaryOperatorExpression *)
            __dynamic_cast(expression,&Expression::typeinfo,&BinaryOperatorExpression::typeinfo,0);
  if (this_00 == (BinaryOperatorExpression *)0x0) {
    return false;
  }
  Operator::Operator(&local_70);
  Operator::Operator(&local_c0);
  bVar1 = CalculationEngine::getBinaryOperator(this->mCalcEngine,op,&local_70);
  if (bVar1) {
    this_01 = this->mCalcEngine;
    opChar = BinaryOperatorExpression::op(this_00);
    bVar1 = CalculationEngine::getBinaryOperator(this_01,opChar,&local_c0);
    if (bVar1) {
      iVar2 = Operator::precedence(&local_70);
      iVar3 = Operator::precedence(&local_c0);
      bVar4 = iVar3 < iVar2;
      bVar5 = 1;
      goto LAB_0012c2bf;
    }
  }
  bVar4 = (byte)this_01;
  bVar5 = 0;
LAB_0012c2bf:
  if (local_c0.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.mUnaryFn,(_Any_data *)&local_c0.mUnaryFn,__destroy_functor);
  }
  if (local_c0.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.mBinaryFn,(_Any_data *)&local_c0.mBinaryFn,__destroy_functor);
  }
  if (local_70.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_70.mUnaryFn,(_Any_data *)&local_70.mUnaryFn,__destroy_functor);
  }
  if (local_70.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_70.mBinaryFn,(_Any_data *)&local_70.mBinaryFn,__destroy_functor);
  }
  return (bool)(bVar4 & bVar5);
}

Assistant:

bool PrintVisitor::needParentheses(Expression* expression, OperatorChar op) {
	if (auto binaryOperatorExpression = dynamic_cast<BinaryOperatorExpression*>(expression)) {
		Operator inputOperator;
		Operator nodeOperator;
		if (mCalcEngine.getBinaryOperator(op, inputOperator)
			&& mCalcEngine.getBinaryOperator(binaryOperatorExpression->op(), nodeOperator)) {
			return inputOperator.precedence() > nodeOperator.precedence();
		}
	}

	return false;
}